

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

void glfwSetInputMode(GLFWwindow *handle,int mode,int value)

{
  GLFWbool GVar1;
  int i;
  long lVar2;
  ulong uVar3;
  uint enabled;
  char *pcVar4;
  int code;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/src/input.c"
                  ,0x1fb,"void glfwSetInputMode(GLFWwindow *, int, int)");
  }
  if (_glfw.initialized == 0) {
    code = 0x10001;
    pcVar4 = (char *)0x0;
LAB_0011b801:
    _glfwInputError(code,pcVar4);
    return;
  }
  uVar3 = (ulong)(uint)mode;
  switch(mode) {
  case 0x33001:
    if (value - 0x34004U < 0xfffffffd) {
      pcVar4 = "Invalid cursor mode 0x%08X";
      uVar3 = (ulong)(uint)value;
      goto LAB_0011b891;
    }
    if (*(int *)(handle + 0x74) != value) {
      *(int *)(handle + 0x74) = value;
      _glfwPlatformGetCursorPos
                ((_GLFWwindow *)handle,(double *)(handle + 0x1e0),(double *)(handle + 0x1e8));
      _glfwPlatformSetCursorMode((_GLFWwindow *)handle,value);
      return;
    }
    break;
  case 0x33002:
    if (*(uint *)(handle + 0x68) != (uint)(value != 0)) {
      if (value == 0) {
        for (lVar2 = 0x80; lVar2 != 0x1dd; lVar2 = lVar2 + 1) {
          if (handle[lVar2] == (GLFWwindow)0x3) {
            handle[lVar2] = (GLFWwindow)0x0;
          }
        }
      }
      *(uint *)(handle + 0x68) = (uint)(value != 0);
    }
    break;
  case 0x33003:
    if (*(uint *)(handle + 0x6c) != (uint)(value != 0)) {
      if (value == 0) {
        for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
          if (handle[lVar2 + 0x78] == (GLFWwindow)0x3) {
            handle[lVar2 + 0x78] = (GLFWwindow)0x0;
          }
        }
      }
      *(uint *)(handle + 0x6c) = (uint)(value != 0);
    }
    break;
  case 0x33004:
    *(uint *)(handle + 0x70) = (uint)(value != 0);
    break;
  case 0x33005:
    GVar1 = _glfwPlatformRawMouseMotionSupported();
    if (GVar1 == 0) {
      pcVar4 = "Raw mouse motion is not supported on this system";
      code = 0x10008;
      goto LAB_0011b801;
    }
    enabled = (uint)(value != 0);
    if (*(uint *)(handle + 0x1f0) != enabled) {
      *(uint *)(handle + 0x1f0) = enabled;
      _glfwPlatformSetRawMouseMotion((_GLFWwindow *)handle,enabled);
      return;
    }
    break;
  default:
    pcVar4 = "Invalid input mode 0x%08X";
LAB_0011b891:
    _glfwInputError(0x10003,pcVar4,uVar3);
    return;
  }
  return;
}

Assistant:

GLFWAPI void glfwSetInputMode(GLFWwindow* handle, int mode, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (mode == GLFW_CURSOR)
    {
        if (value != GLFW_CURSOR_NORMAL &&
            value != GLFW_CURSOR_HIDDEN &&
            value != GLFW_CURSOR_DISABLED)
        {
            _glfwInputError(GLFW_INVALID_ENUM,
                            "Invalid cursor mode 0x%08X",
                            value);
            return;
        }

        if (window->cursorMode == value)
            return;

        window->cursorMode = value;

        _glfwPlatformGetCursorPos(window,
                                  &window->virtualCursorPosX,
                                  &window->virtualCursorPosY);
        _glfwPlatformSetCursorMode(window, value);
    }
    else if (mode == GLFW_STICKY_KEYS)
    {
        value = value ? GLFW_TRUE : GLFW_FALSE;
        if (window->stickyKeys == value)
            return;

        if (!value)
        {
            int i;

            // Release all sticky keys
            for (i = 0;  i <= GLFW_KEY_LAST;  i++)
            {
                if (window->keys[i] == _GLFW_STICK)
                    window->keys[i] = GLFW_RELEASE;
            }
        }

        window->stickyKeys = value;
    }
    else if (mode == GLFW_STICKY_MOUSE_BUTTONS)
    {
        value = value ? GLFW_TRUE : GLFW_FALSE;
        if (window->stickyMouseButtons == value)
            return;

        if (!value)
        {
            int i;

            // Release all sticky mouse buttons
            for (i = 0;  i <= GLFW_MOUSE_BUTTON_LAST;  i++)
            {
                if (window->mouseButtons[i] == _GLFW_STICK)
                    window->mouseButtons[i] = GLFW_RELEASE;
            }
        }

        window->stickyMouseButtons = value;
    }
    else if (mode == GLFW_LOCK_KEY_MODS)
    {
        window->lockKeyMods = value ? GLFW_TRUE : GLFW_FALSE;
    }
    else if (mode == GLFW_RAW_MOUSE_MOTION)
    {
        if (!_glfwPlatformRawMouseMotionSupported())
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Raw mouse motion is not supported on this system");
            return;
        }

        value = value ? GLFW_TRUE : GLFW_FALSE;
        if (window->rawMouseMotion == value)
            return;

        window->rawMouseMotion = value;
        _glfwPlatformSetRawMouseMotion(window, value);
    }
    else
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode 0x%08X", mode);
}